

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O2

void __thiscall sf::Font::Font(Font *this,Font *copy)

{
  int *piVar1;
  void *pvVar2;
  
  pvVar2 = copy->m_face;
  this->m_library = copy->m_library;
  this->m_face = pvVar2;
  pvVar2 = copy->m_stroker;
  this->m_streamRec = copy->m_streamRec;
  this->m_stroker = pvVar2;
  this->m_refCount = copy->m_refCount;
  this->m_isSmooth = copy->m_isSmooth;
  std::__cxx11::string::string((string *)&this->m_info,(string *)&copy->m_info);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sf::Font::Page>,_std::_Select1st<std::pair<const_unsigned_int,_sf::Font::Page>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  ::_Rb_tree(&(this->m_pages)._M_t,&(copy->m_pages)._M_t);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->m_pixelBuffer,&copy->m_pixelBuffer);
  piVar1 = this->m_refCount;
  if (piVar1 != (int *)0x0) {
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

Font::Font(const Font& copy) :
m_library    (copy.m_library),
m_face       (copy.m_face),
m_streamRec  (copy.m_streamRec),
m_stroker    (copy.m_stroker),
m_refCount   (copy.m_refCount),
m_isSmooth   (copy.m_isSmooth),
m_info       (copy.m_info),
m_pages      (copy.m_pages),
m_pixelBuffer(copy.m_pixelBuffer)
{
    #ifdef SFML_SYSTEM_ANDROID
        m_stream = NULL;
    #endif

    // Note: as FreeType doesn't provide functions for copying/cloning,
    // we must share all the FreeType pointers

    if (m_refCount)
        (*m_refCount)++;
}